

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::write_enum_id(CTcDataStream *this,ulong enum_id)

{
  CTcDataStream *in_RDI;
  CTcDataStream *unaff_retaddr;
  
  if (G_keep_enumfixups != 0) {
    get_ofs(in_RDI);
    CTcIdFixup::add_fixup
              ((CTcIdFixup **)this,(CTcDataStream *)enum_id,(ulong)unaff_retaddr,(ulong)in_RDI);
  }
  write4(unaff_retaddr,(ulong)in_RDI);
  return;
}

Assistant:

void CTcDataStream::write_enum_id(ulong enum_id)
{
    /* if there's a fixup list, add this reference */
    if (G_keep_enumfixups)
        CTcIdFixup::add_fixup(&G_enumfixup, this, get_ofs(), enum_id);

    /* write the ID */
    write4(enum_id);
}